

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

void Abc_SopComplementVar(char *pSop,int iVar)

{
  int iVar1;
  char cVar2;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  if (iVar1 <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x27a,"void Abc_SopComplementVar(char *, int)");
  }
  do {
    if (*pSop == '\0') {
      return;
    }
    if (pSop[iVar] == '0') {
      cVar2 = '1';
LAB_001de7c6:
      pSop[iVar] = cVar2;
    }
    else if (pSop[iVar] == '1') {
      cVar2 = '0';
      goto LAB_001de7c6;
    }
    pSop = pSop + (iVar1 + 3);
  } while( true );
}

Assistant:

void Abc_SopComplementVar( char * pSop, int iVar )
{
    char * pCube;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( iVar < nVars );
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[iVar] == '0' )
            pCube[iVar] = '1';
        else if ( pCube[iVar] == '1' )
            pCube[iVar] = '0';
    }
}